

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O2

unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true> __thiscall
duckdb::SecretManager::GetSecretByName
          (SecretManager *this,CatalogTransaction transaction,string *name,string *storage)

{
  unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true> __p;
  SecretStorage *pSVar1;
  InternalException *this_00;
  InvalidInputException *this_01;
  string *in_RCX;
  optional_ptr<duckdb::SecretStorage,_true> oVar2;
  bool bVar3;
  allocator local_c1;
  unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true> result;
  unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true> lookup;
  optional_ptr<duckdb::SecretStorage,_true> storage_lookup;
  SecretStorage *local_a8;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  InitializeSecrets((SecretManager *)name,transaction);
  result.super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
  super___uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SecretEntry_*,_std::default_delete<duckdb::SecretEntry>_>.
  super__Head_base<0UL,_duckdb::SecretEntry_*,_false>._M_head_impl =
       (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
       (__uniq_ptr_data<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true,_true>)
       0x0;
  if (in_RCX->_M_string_length == 0) {
    GetSecretStorages((vector<std::reference_wrapper<duckdb::SecretStorage>,_true> *)&storage_lookup
                      ,(SecretManager *)name);
    bVar3 = false;
    for (oVar2 = storage_lookup; oVar2.ptr != local_a8;
        oVar2.ptr = (SecretStorage *)&(oVar2.ptr)->storage_name) {
      (**(code **)(*(oVar2.ptr)->_vptr_SecretStorage + 0x38))
                (&lookup.
                  super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>,
                 (oVar2.ptr)->_vptr_SecretStorage,storage,&transaction);
      __p = lookup;
      if (lookup.super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>.
          _M_t.super___uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::SecretEntry_*,_std::default_delete<duckdb::SecretEntry>_>.
          super__Head_base<0UL,_duckdb::SecretEntry_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true,_true>
           )0x0) {
        if (bVar3) {
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_90,
                     "Ambiguity detected for secret name \'%s\', secret occurs in multiple storage backends."
                     ,&local_c1);
          ::std::__cxx11::string::string((string *)&local_70,(string *)storage);
          InternalException::InternalException<std::__cxx11::string>(this_00,&local_90,&local_70);
          __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        lookup.super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t
        .super___uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::SecretEntry_*,_std::default_delete<duckdb::SecretEntry>_>.
        super__Head_base<0UL,_duckdb::SecretEntry_*,_false>._M_head_impl =
             (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
             (__uniq_ptr_data<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true,_true>
              )0x0;
        ::std::__uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>::
        reset((__uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_> *)
              &result,(pointer)__p.
                               super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::SecretEntry_*,_std::default_delete<duckdb::SecretEntry>_>
                               .super__Head_base<0UL,_duckdb::SecretEntry_*,_false>._M_head_impl);
        bVar3 = true;
      }
      ::std::unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>::~unique_ptr
                (&lookup.
                  super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>);
    }
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
                     *)&storage_lookup);
    this->_vptr_SecretManager =
         (_func_int **)
         result.super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>.
         _M_t.super___uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::SecretEntry_*,_std::default_delete<duckdb::SecretEntry>_>.
         super__Head_base<0UL,_duckdb::SecretEntry_*,_false>._M_head_impl;
    result.super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
    super___uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SecretEntry_*,_std::default_delete<duckdb::SecretEntry>_>.
    super__Head_base<0UL,_duckdb::SecretEntry_*,_false>._M_head_impl =
         (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
         (__uniq_ptr_data<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true,_true>
         )0x0;
  }
  else {
    storage_lookup = GetSecretStorage((SecretManager *)name,in_RCX);
    if (storage_lookup.ptr == (SecretStorage *)0x0) {
      this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_90,"Unknown secret storage found: \'%s\'",(allocator *)&lookup);
      ::std::__cxx11::string::string((string *)&local_50,(string *)in_RCX);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (this_01,&local_90,&local_50);
      __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pSVar1 = optional_ptr<duckdb::SecretStorage,_true>::operator->(&storage_lookup);
    (*pSVar1->_vptr_SecretStorage[7])(this,pSVar1,storage,&transaction);
  }
  ::std::unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>::~unique_ptr
            (&result.
              super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>);
  return (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
         (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)this;
}

Assistant:

unique_ptr<SecretEntry> SecretManager::GetSecretByName(CatalogTransaction transaction, const string &name,
                                                       const string &storage) {
	InitializeSecrets(transaction);

	unique_ptr<SecretEntry> result = nullptr;
	bool found = false;

	if (!storage.empty()) {
		auto storage_lookup = GetSecretStorage(storage);

		if (!storage_lookup) {
			throw InvalidInputException("Unknown secret storage found: '%s'", storage);
		}

		return storage_lookup->GetSecretByName(name, &transaction);
	}

	for (const auto &storage_ref : GetSecretStorages()) {
		auto lookup = storage_ref.get().GetSecretByName(name, &transaction);
		if (lookup) {
			if (found) {
				throw InternalException(
				    "Ambiguity detected for secret name '%s', secret occurs in multiple storage backends.", name);
			}

			result = std::move(lookup);
			found = true;
		}
	}

	return result;
}